

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetAppleArchs
          (cmGeneratorTarget *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *archVec)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmValue cVar3;
  string_view arg;
  string defVarName;
  cmAlphaNum local_d0;
  string local_a0;
  string local_80;
  cmAlphaNum local_60;
  
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"APPLE",(allocator<char> *)&local_60);
  bVar2 = cmMakefile::IsOn(pcVar1,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (!bVar2) {
    return;
  }
  if (config->_M_string_length == 0) {
LAB_003d79f2:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"OSX_ARCHITECTURES",(allocator<char> *)&local_60);
    cVar3 = GetProperty(this,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    if (cVar3.Value == (string *)0x0) goto LAB_003d7a38;
  }
  else {
    local_d0.View_._M_len = 0x12;
    local_d0.View_._M_str = "OSX_ARCHITECTURES_";
    cmsys::SystemTools::UpperCase(&local_80,config);
    local_60.View_._M_len = local_80._M_string_length;
    local_60.View_._M_str = local_80._M_dataplus._M_p;
    cmStrCat<>(&local_a0,&local_d0,&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    cVar3 = GetProperty(this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    if (cVar3.Value == (string *)0x0) goto LAB_003d79f2;
  }
  arg._M_str = ((cVar3.Value)->_M_dataplus)._M_p;
  arg._M_len = (cVar3.Value)->_M_string_length;
  cmExpandList(arg,archVec,false);
LAB_003d7a38:
  if ((archVec->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (archVec->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"_CMAKE_APPLE_ARCHS_DEFAULT",(allocator<char> *)&local_60);
    cmMakefile::GetDefExpandList(pcVar1,(string *)&local_d0,archVec,false);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetAppleArchs(const std::string& config,
                                      std::vector<std::string>& archVec) const
{
  if (!this->Makefile->IsOn("APPLE")) {
    return;
  }
  cmValue archs = nullptr;
  if (!config.empty()) {
    std::string defVarName =
      cmStrCat("OSX_ARCHITECTURES_", cmSystemTools::UpperCase(config));
    archs = this->GetProperty(defVarName);
  }
  if (!archs) {
    archs = this->GetProperty("OSX_ARCHITECTURES");
  }
  if (archs) {
    cmExpandList(*archs, archVec);
  }
  if (archVec.empty()) {
    this->Makefile->GetDefExpandList("_CMAKE_APPLE_ARCHS_DEFAULT", archVec);
  }
}